

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O3

void __thiscall fmcalc::init_profile__stepped_rec(fmcalc *this,fm_profile_step *f)

{
  vector<tc_rec,_std::allocator<tc_rec>_> *tc_vec;
  uchar uVar1;
  pointer pvVar2;
  undefined8 extraout_RAX;
  long lVar3;
  uchar tc_id;
  long lVar4;
  value_type local_48;
  
  tc_vec = &local_48.tc_vec;
  local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.calcrule_id = f->calcrule_id;
  local_48.step_id = f->step_id;
  tc_id = '\x05';
  lVar4 = 0x3c;
  lVar3 = 8;
  uVar1 = '\0';
  switch(local_48.calcrule_id) {
  case 0xc:
    break;
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x21:
  case 0x23:
  case 0x24:
switchD_0010e3ac_caseD_d:
    init_profile__stepped_rec();
    if (local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  case 0xe:
    uVar1 = '\x04';
    lVar3 = 0x18;
    break;
  case 0x1b:
  case 0x1e:
    add_tc('\0',f->deductible1,tc_vec);
    add_tc('\x05',f->limit2,tc_vec);
    uVar1 = '\x04';
    lVar3 = 0x18;
    goto LAB_0010e44d;
  case 0x1c:
  case 0x1d:
  case 0x1f:
    add_tc('\0',f->deductible1,tc_vec);
    uVar1 = '\x05';
    lVar3 = 0x3c;
LAB_0010e44d:
    add_tc(uVar1,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),tc_vec);
    tc_id = '\v';
    lVar4 = 0x34;
  case 0x26:
switchD_0010e3ac_caseD_26:
    add_tc(tc_id,*(OASIS_FLOAT *)((long)&f->profile_id + lVar4),tc_vec);
    add_tc('\r',f->scale1,tc_vec);
    add_tc('\x0e',f->scale2,tc_vec);
    add_tc('\t',f->trigger_start,tc_vec);
    uVar1 = '\n';
    lVar3 = 0x30;
    break;
  case 0x20:
    add_tc('\v',f->payout_start,tc_vec);
    add_tc('\r',f->scale1,tc_vec);
    add_tc('\t',f->trigger_start,tc_vec);
    add_tc('\x04',f->limit1,tc_vec);
    add_tc('\x05',f->limit2,tc_vec);
    uVar1 = '\x0e';
    lVar3 = 0x44;
    break;
  case 0x22:
    goto switchD_0010e3ac_caseD_22;
  case 0x25:
    add_tc('\0',f->deductible1,tc_vec);
    add_tc('\x05',f->limit2,tc_vec);
    add_tc('\x04',f->limit1,tc_vec);
    add_tc('\v',f->payout_start,tc_vec);
    add_tc('\r',f->scale1,tc_vec);
    add_tc('\x0e',f->scale2,tc_vec);
    add_tc('\t',f->trigger_start,tc_vec);
    add_tc('\n',f->trigger_end,tc_vec);
    goto switchD_0010e3ac_caseD_26;
  default:
    if (local_48.calcrule_id == 100) goto LAB_0010e4ca;
    if (local_48.calcrule_id != 2) goto switchD_0010e3ac_caseD_d;
    add_tc('\0',f->deductible1,tc_vec);
    uVar1 = '\x04';
    lVar3 = 0x18;
switchD_0010e3ac_caseD_22:
    add_tc(uVar1,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),tc_vec);
    add_tc('\x06',f->share1,tc_vec);
    uVar1 = '\x03';
    lVar3 = 0x14;
  }
  add_tc(uVar1,*(OASIS_FLOAT *)((long)&f->profile_id + lVar3),tc_vec);
LAB_0010e4ca:
  pvVar2 = (this->profile_vec_stepped_).
           super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)f->profile_id;
  if ((ulong)(((long)(this->profile_vec_stepped_).
                     super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
             -0x5555555555555555) < lVar3 + 1U) {
    std::
    vector<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
    ::resize(&this->profile_vec_stepped_,lVar3 + 1U);
    lVar3 = (long)f->profile_id;
    pvVar2 = (this->profile_vec_stepped_).
             super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>::push_back
            (pvVar2 + lVar3,&local_48);
  if (local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.tc_vec.super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fmcalc::init_profile__stepped_rec(fm_profile_step& f)
{
	profile_rec_new p;
	p.calcrule_id = f.calcrule_id;
	p.step_id = f.step_id;
	switch (p.calcrule_id) {
		case 2:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 12:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			break;
		case 14:
			add_tc(limit_1, f.limit1, p.tc_vec);
			break;
		case 27:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 28:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 29:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 30:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 31:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 32:
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			break;
		case 34:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(share_1, f.share1, p.tc_vec);
			add_tc(attachment_1, f.attachment, p.tc_vec);
			break;
		case 37:
			add_tc(deductible_1, f.deductible1, p.tc_vec);
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(limit_1, f.limit1, p.tc_vec);
			add_tc(payout_start, f.payout_start, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
		case 38:
			add_tc(limit_2, f.limit2, p.tc_vec);
			add_tc(scale_1, f.scale1, p.tc_vec);
			add_tc(scale_2, f.scale2, p.tc_vec);
			add_tc(trigger_start, f.trigger_start, p.tc_vec);
			add_tc(trigger_end, f.trigger_end, p.tc_vec);
			break;
		case 100:
			break;
		default:
		{
			fprintf(stderr, "FATAL: Invalid calc rule for stepped policies\n");
			exit(EXIT_FAILURE);
		}
	}
	if (profile_vec_stepped_.size() < ((size_t) f.profile_id) + 1 ) {
		profile_vec_stepped_.resize((size_t) f.profile_id + 1);
	}
	profile_vec_stepped_[f.profile_id].push_back(p);
}